

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufPerformOne(Buf_Man_t *p,int iPivot,int fSkipDup,int fVerbose)

{
  Abc_Ntk_t *pNtk;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  Mio_Gate_t *pMVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int i;
  uint uVar15;
  bool bVar16;
  double dVar17;
  
  if (p->nObjAlloc <= p->pNtk->vObjs->nSize + 0x1e) {
    __assert_fail("Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x36a,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
  }
  pAVar6 = Abc_NtkObj(p->pNtk,iPivot);
  iVar1 = Abc_BufCountNonCritical(p,pAVar6);
  uVar11 = (pAVar6->vFanouts).nSize - iVar1;
  if (fVerbose != 0) {
    uVar12 = pAVar6->Id;
    pcVar7 = Mio_GateReadName((Mio_Gate_t *)(pAVar6->field_5).pData);
    printf("ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ",(ulong)uVar12,pcVar7,
           (ulong)(uint)(pAVar6->vFanins).nSize,(ulong)(uint)(pAVar6->vFanouts).nSize,(ulong)uVar11)
    ;
  }
  if (1 < iVar1 && 0 < (int)uVar11) {
    pAVar8 = Abc_NtkCreateNodeBuf(p->pNtk,pAVar6);
    for (iVar1 = 0; iVar1 < p->vNonCrit->nSize; iVar1 = iVar1 + 1) {
      pNtk = p->pNtk;
      iVar2 = Vec_IntEntry(p->vNonCrit,iVar1);
      pAVar9 = Abc_NtkObj(pNtk,iVar2);
      if (pAVar9 != (Abc_Obj_t *)0x0) {
        Abc_ObjPatchFanin(pAVar9,pAVar6,pAVar8);
      }
    }
    Abc_BufCreateEdges(p,pAVar8);
    Abc_BufUpdateArr(p,pAVar8);
    Abc_BufUpdateDep(p,pAVar8);
    Abc_BufAddToQue(p,pAVar6);
    Abc_BufAddToQue(p,pAVar8);
    Abc_SclTimeIncUpdateLevel(pAVar8);
    p->nSeparate = p->nSeparate + 1;
    if (fVerbose == 0) {
      return;
    }
    pcVar7 = "Adding buffer";
    goto LAB_003ac6fc;
  }
  if ((fSkipDup == 0) && (0 < (int)uVar11)) {
    iVar1 = (pAVar6->vFanouts).nSize;
    if (((*(uint *)&pAVar6->field_0x14 & 0xf) == 7) && (p->nFanMin < iVar1)) {
      pAVar8 = Abc_NtkDupObj(p->pNtk,pAVar6,0);
      for (lVar14 = 0; lVar14 < (pAVar6->vFanins).nSize; lVar14 = lVar14 + 1) {
        Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)
                               pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar14]]);
      }
      Abc_NodeCollectFanouts(pAVar6,p->vFanouts);
      for (iVar1 = 0; iVar1 < p->vFanouts->nSize / 2; iVar1 = iVar1 + 1) {
        pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(p->vFanouts,iVar1);
        Abc_ObjPatchFanin(pAVar9,pAVar6,pAVar8);
      }
      Abc_BufCreateEdges(p,pAVar8);
      iVar1 = Abc_BufNodeArr(p,pAVar6);
      Abc_BufSetNodeArr(p,pAVar8,iVar1);
      Abc_BufUpdateDep(p,pAVar6);
      Abc_BufUpdateDep(p,pAVar8);
      Abc_BufAddToQue(p,pAVar6);
      Abc_BufAddToQue(p,pAVar8);
      for (lVar14 = 0; lVar14 < (pAVar6->vFanins).nSize; lVar14 = lVar14 + 1) {
        Abc_BufAddToQue(p,(Abc_Obj_t *)pAVar6->pNtk->vObjs->pArray[(pAVar6->vFanins).pArray[lVar14]]
                       );
      }
      Abc_SclTimeIncUpdateLevel(pAVar8);
      p->nDuplicate = p->nDuplicate + 1;
      if (fVerbose == 0) {
        return;
      }
      pcVar7 = "Duplicating node";
      goto LAB_003ac6fc;
    }
LAB_003ac38d:
    if (iVar1 < 9) goto LAB_003ac392;
  }
  else {
    iVar1 = (pAVar6->vFanouts).nSize;
    if (0 < (int)uVar11) goto LAB_003ac38d;
LAB_003ac392:
    if (iVar1 <= p->nFanMax) {
      if (fVerbose == 0) {
        return;
      }
      pcVar7 = "Doing nothing";
LAB_003ac6fc:
      puts(pcVar7);
      return;
    }
  }
  dVar17 = (double)iVar1;
  iVar1 = p->pNtk->vObjs->nSize;
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  uVar12 = 10;
  if ((int)ABS(dVar17) < 10) {
    uVar12 = (int)ABS(dVar17);
  }
  iVar2 = (pAVar6->vFanouts).nSize;
  iVar3 = iVar2 / (int)uVar12;
  iVar2 = iVar2 % (int)uVar12;
  p->nBranchCrit = p->nBranchCrit + (uint)(0 < (int)uVar11);
  Abc_NodeCollectFanouts(pAVar6,p->vFanouts);
  if (((*(uint *)&pAVar6->field_0x14 & 0xf) == 7) && (iVar4 = Abc_NodeIsBuf(pAVar6), iVar4 != 0)) {
    p->nBranch0 = p->nBranch0 + 1;
    pMVar10 = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
    (pAVar6->field_5).pData = pMVar10;
    p_00 = p->vEdges;
    iVar4 = Vec_IntEntry(p->vOffsets,pAVar6->Id);
    Vec_IntWriteEntry(p_00,iVar4,1000);
    iVar4 = Abc_NodeIsInv(pAVar6);
    if (iVar4 == 0) {
      __assert_fail("Abc_NodeIsInv(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                    ,0x3b1,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
    }
    uVar11 = 0;
    if (0 < (int)uVar12) {
      uVar11 = uVar12;
    }
    while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
      Abc_NtkCreateNodeInv(p->pNtk,pAVar6);
    }
    if (fVerbose == 0) goto LAB_003ac4de;
    pcVar7 = "Adding %d inverters\n";
  }
  else {
    p->nBranch1 = p->nBranch1 + 1;
    uVar11 = 0;
    if (0 < (int)uVar12) {
      uVar11 = uVar12;
    }
    while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
      Abc_NtkCreateNodeBuf(p->pNtk,pAVar6);
    }
    if (fVerbose == 0) goto LAB_003ac4de;
    pcVar7 = "Adding %d buffers\n";
  }
  printf(pcVar7,(ulong)uVar12);
LAB_003ac4de:
  iVar4 = iVar3 + 1;
  iVar13 = iVar4 * iVar2;
  i = 0;
  while( true ) {
    if (p->vFanouts->nSize <= i) {
      iVar2 = iVar1;
      uVar11 = 0;
      uVar15 = 0;
      if (0 < (int)uVar12) {
        uVar11 = uVar12;
        uVar15 = uVar12;
      }
      while (uVar11 != 0) {
        pAVar8 = Abc_NtkObj(p->pNtk,iVar2);
        Abc_BufCreateEdges(p,pAVar8);
        iVar2 = iVar2 + 1;
        uVar11 = uVar11 - 1;
      }
      Abc_BufUpdateArr(p,pAVar6);
      iVar2 = iVar1;
      uVar11 = uVar15;
      while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
        pAVar8 = Abc_NtkObj(p->pNtk,iVar2);
        Abc_BufComputeDep(p,pAVar8);
        iVar2 = iVar2 + 1;
      }
      Abc_BufUpdateDep(p,pAVar6);
      iVar2 = iVar1;
      uVar11 = uVar15;
      while (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16) {
        pAVar6 = Abc_NtkObj(p->pNtk,iVar2);
        Abc_BufAddToQue(p,pAVar6);
        iVar2 = iVar2 + 1;
      }
      while (bVar16 = uVar15 != 0, uVar15 = uVar15 - 1, bVar16) {
        pAVar6 = Abc_NtkObj(p->pNtk,iVar1);
        Abc_SclTimeIncUpdateLevel(pAVar6);
        iVar1 = iVar1 + 1;
      }
      return;
    }
    pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(p->vFanouts,i);
    if (i < iVar13) {
      iVar5 = i / iVar4;
    }
    else {
      iVar5 = (i - iVar13) / iVar3 + iVar2;
    }
    if ((iVar5 < 0) || ((int)uVar12 <= iVar5)) break;
    pAVar9 = Abc_NtkObj(p->pNtk,iVar5 + iVar1);
    Abc_ObjPatchFanin(pAVar8,pAVar6,pAVar9);
    i = i + 1;
  }
  __assert_fail("j >= 0 && j < nDegree",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                ,0x3c3,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
}

Assistant:

void Abc_BufPerformOne( Buf_Man_t * p, int iPivot, int fSkipDup, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, j, nCrit, nNonCrit;
//    int DelayMax = p->DelayMax;
    assert( Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc );
    pObj     = Abc_NtkObj( p->pNtk, iPivot );
//    assert( Vec_FltEntry(p->vCounts, iPivot) == (float)Abc_ObjFanoutNum(pObj) );
    nNonCrit = Abc_BufCountNonCritical( p, pObj );
    nCrit    = Abc_ObjFanoutNum(pObj) - nNonCrit;
if ( fVerbose )
{
//Abc_BufPrintOne( p, iPivot );
printf( "ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ", 
    Abc_ObjId(pObj), Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), nCrit );
}
    // consider three cases
    if ( nCrit > 0 && nNonCrit > 1 )
    {
        // (1) both critical and non-critical are present - split them by adding buffer
        Abc_Obj_t * pBuffer = Abc_NtkCreateNodeBuf( p->pNtk, pObj );
        Abc_NtkForEachObjVec( p->vNonCrit, p->pNtk, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        // update timing
        Abc_BufCreateEdges( p, pBuffer );
        Abc_BufUpdateArr( p, pBuffer );
        Abc_BufUpdateDep( p, pBuffer );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pBuffer );
        Abc_SclTimeIncUpdateLevel( pBuffer );
        p->nSeparate++;
if ( fVerbose )
printf( "Adding buffer\n" );
    }
    else if ( !fSkipDup && nCrit > 0 && Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > p->nFanMin )//&& Abc_ObjLevel(pObj) < 4 )//&& Abc_ObjFaninNum(pObj) < 2 )
    {
        // (2) only critical are present - duplicate
        Abc_Obj_t * pClone = Abc_NtkDupObj( p->pNtk, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_ObjAddFanin( pClone, pFanout );
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        Vec_PtrForEachEntryStop( Abc_Obj_t *, p->vFanouts, pFanout, i, Vec_PtrSize(p->vFanouts)/2 )
            Abc_ObjPatchFanin( pFanout, pObj, pClone );
        // update timing
        Abc_BufCreateEdges( p, pClone );
        Abc_BufSetNodeArr( p, pClone, Abc_BufNodeArr(p, pObj) );
        Abc_BufUpdateDep( p, pObj );
        Abc_BufUpdateDep( p, pClone );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pClone );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_BufAddToQue( p, pFanout );
        Abc_SclTimeIncUpdateLevel( pClone );
        p->nDuplicate++;
//        printf( "Duplicating %s on level %d\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjLevel(pObj) );
if ( fVerbose )
printf( "Duplicating node\n" );
    }
    else if ( (nCrit > 0 && Abc_ObjFanoutNum(pObj) > 8) || Abc_ObjFanoutNum(pObj) > p->nFanMax )
    {
        // (2) only critical or only non-critical - add buffer/inverter tree
        int nDegree, n1Degree, n1Number, nFirst;
        int iFirstBuf = Abc_NtkObjNumMax( p->pNtk );
//        nDegree  = Abc_MinInt( 3, (int)pow(Abc_ObjFanoutNum(pObj), 0.34) );
        nDegree  = Abc_MinInt( 10, (int)pow(Abc_ObjFanoutNum(pObj), 0.5) );
        n1Degree = Abc_ObjFanoutNum(pObj) / nDegree + 1;
        n1Number = Abc_ObjFanoutNum(pObj) % nDegree;
        nFirst   = n1Degree * n1Number;
        p->nBranchCrit += (nCrit > 0);
        // create inverters
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        if ( Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj) )
        {
            p->nBranch0++;
            pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
            Abc_BufSetEdgeDelay( p, pObj, 0, BUF_SCALE );
            assert( Abc_NodeIsInv(pObj) );
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeInv( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d inverters\n", nDegree );
        }
        else
        {
            p->nBranch1++;
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeBuf( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d buffers\n", nDegree );
        }
        // connect inverters
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, i )
        {
            j = (i < nFirst) ? i/n1Degree : n1Number + ((i - nFirst)/(n1Degree - 1));
            assert( j >= 0 && j < nDegree );
            Abc_ObjPatchFanin( pFanout, pObj, Abc_NtkObj(p->pNtk, iFirstBuf + j) );
        }
        // update timing
        for ( i = 0; i < nDegree; i++ )
            Abc_BufCreateEdges( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateArr( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufComputeDep( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateDep( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufAddToQue( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        for ( i = 0; i < nDegree; i++ )
            Abc_SclTimeIncUpdateLevel( Abc_NtkObj(p->pNtk, iFirstBuf + i) );
    }
    else
    {
if ( fVerbose )
printf( "Doing nothing\n" );
    }
//    if ( DelayMax != p->DelayMax )
//        printf( "%d (%.2f)  ", p->DelayMax, 1.0 * p->DelayMax * p->DelayInv / BUF_SCALE );
}